

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FramebufferCompletenessCase::~FramebufferCompletenessCase
          (FramebufferCompletenessCase *this)

{
  FramebufferCompletenessCase *this_local;
  
  ~FramebufferCompletenessCase(this);
  operator_delete(this,200);
  return;
}

Assistant:

virtual						~FramebufferCompletenessCase	 (void) {}